

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void vkt::sr::anon_unknown_0::eval_rightShiftVecScalar_ivec2(ShaderEvalContext *c)

{
  float fVar1;
  byte bVar2;
  int i;
  long lVar3;
  int i_1;
  Vector<int,_2> res;
  Vector<int,_2> result;
  Vector<float,_2> res_1;
  float local_18 [2];
  Vec4 *local_10;
  int local_8 [2];
  
  local_18[0] = c->in[0].m_data[3];
  local_18[1] = c->in[0].m_data[1];
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  lVar3 = 0;
  do {
    res.m_data[lVar3] = (int)local_18[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  fVar1 = c->in[1].m_data[0];
  lVar3 = 0;
  do {
    *(int *)((long)&local_10 + lVar3 * 4) = (int)fVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  result.m_data[0] = 0;
  result.m_data[1] = 0;
  lVar3 = 0;
  do {
    bVar2 = *(byte *)((long)&local_10 + lVar3 * 4);
    result.m_data[lVar3] =
         res.m_data[lVar3] >> 0x1f & ~(0xffffffffU >> (bVar2 & 0x1f)) |
         res.m_data[lVar3] >> (bVar2 & 0x1f);
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  lVar3 = 0;
  do {
    res_1.m_data[lVar3] = (float)result.m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  local_10 = &c->color;
  local_8[0] = 1;
  local_8[1] = 2;
  lVar3 = 0;
  do {
    (c->color).m_data[local_8[lVar3]] = res_1.m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }